

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::EnhancedLayouts::UniformBlockMemberInvalidOffsetAlignmentTest::getTestCaseName_abi_cxx11_
          (string *__return_storage_ptr__,UniformBlockMemberInvalidOffsetAlignmentTest *this,
          GLuint test_case_index)

{
  reference pvVar1;
  ostream *poVar2;
  GLchar *pGVar3;
  testCase *test_case;
  stringstream stream;
  ostream local_198;
  uint local_1c;
  UniformBlockMemberInvalidOffsetAlignmentTest *pUStack_18;
  GLuint test_case_index_local;
  UniformBlockMemberInvalidOffsetAlignmentTest *this_local;
  
  local_1c = test_case_index;
  pUStack_18 = this;
  this_local = (UniformBlockMemberInvalidOffsetAlignmentTest *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&test_case);
  pvVar1 = std::
           vector<gl4cts::EnhancedLayouts::UniformBlockMemberInvalidOffsetAlignmentTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberInvalidOffsetAlignmentTest::testCase>_>
           ::operator[](&this->m_test_cases,(ulong)local_1c);
  poVar2 = std::operator<<(&local_198,"Type: ");
  pGVar3 = Utils::Type::GetGLSLTypeName(&pvVar1->m_type);
  poVar2 = std::operator<<(poVar2,pGVar3);
  poVar2 = std::operator<<(poVar2,", offset: ");
  std::ostream::operator<<(poVar2,pvVar1->m_offset);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&test_case);
  return __return_storage_ptr__;
}

Assistant:

std::string UniformBlockMemberInvalidOffsetAlignmentTest::getTestCaseName(GLuint test_case_index)
{
	std::stringstream stream;
	testCase&		  test_case = m_test_cases[test_case_index];

	stream << "Type: " << test_case.m_type.GetGLSLTypeName() << ", offset: " << test_case.m_offset;

	return stream.str();
}